

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetresizehandler.cpp
# Opt level: O1

void __thiscall QWidgetResizeHandler::mouseMoveEvent(QWidgetResizeHandler *this,QMouseEvent *e)

{
  QWidget *pQVar1;
  QWidgetData *pQVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  Representation RVar6;
  bool bVar7;
  char cVar8;
  int iVar9;
  Representation RVar10;
  ulong uVar11;
  QSize QVar12;
  QSize QVar13;
  undefined4 in_ECX;
  uint uVar14;
  Representation RVar15;
  Representation RVar16;
  long lVar17;
  ulong uVar18;
  Representation RVar19;
  int iVar20;
  Representation RVar21;
  Representation RVar22;
  Representation RVar23;
  Representation RVar24;
  Representation RVar25;
  long in_FS_OFFSET;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  QRect QVar31;
  QStringView QVar32;
  undefined1 auVar33 [16];
  QLatin1String QVar34;
  QPoint pos;
  int local_98;
  QSize local_90;
  QRect local_78;
  undefined1 local_68 [12];
  Representation RStack_5c;
  long local_58;
  QPoint local_48;
  QPoint local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
  pQVar1 = *(QWidget **)(this + 0x10);
  auVar33 = QEventPoint::globalPosition();
  auVar30._0_8_ =
       (double)((ulong)auVar33._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar33._8_8_;
  auVar30._8_8_ =
       (double)((ulong)auVar33._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar33._0_8_;
  auVar30 = minpd(_DAT_0066f5d0,auVar30);
  auVar33._8_8_ = -(ulong)(-2147483648.0 < auVar30._8_8_);
  auVar33._0_8_ = -(ulong)(-2147483648.0 < auVar30._0_8_);
  uVar14 = movmskpd(in_ECX,auVar33);
  uVar18 = (ulong)(uint)(int)auVar30._8_8_;
  uVar11 = (ulong)(uint)(int)auVar30._0_8_ << 0x20;
  if ((uVar14 & 1) == 0) {
    uVar11 = 0x8000000000000000;
  }
  if ((uVar14 & 2) == 0) {
    uVar18 = 0x80000000;
  }
  local_68._0_8_ = uVar18 | uVar11;
  local_40 = QWidget::mapFromGlobal(pQVar1,(QPoint *)local_68);
  if (((byte)this[0x40] & 3) != 0) {
    if ((*(int *)(this + 0x30) != 9) &&
       (bVar7 = QWidget::testAttribute_helper(*(QWidget **)(this + 0x10),WA_WState_ConfigPending),
       !bVar7)) {
      local_48 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
      lVar17 = *(long *)(*(long *)(this + 0x10) + 0x20);
      if (((*(byte *)(lVar17 + 0xc) & 1) == 0) &&
         (pQVar1 = *(QWidget **)(*(long *)(*(long *)(this + 0x10) + 8) + 0x10),
         pQVar1 != (QWidget *)0x0)) {
        auVar30 = QEventPoint::globalPosition();
        auVar26._0_8_ =
             (double)((ulong)auVar30._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
             auVar30._8_8_;
        auVar26._8_8_ =
             (double)((ulong)auVar30._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
             auVar30._0_8_;
        auVar30 = minpd(_DAT_0066f5d0,auVar26);
        auVar27._8_8_ = -(ulong)(-2147483648.0 < auVar30._8_8_);
        auVar27._0_8_ = -(ulong)(-2147483648.0 < auVar30._0_8_);
        uVar14 = movmskpd((int)lVar17,auVar27);
        uVar11 = 0x8000000000000000;
        if ((uVar14 & 1) != 0) {
          uVar11 = (ulong)(uint)(int)auVar30._0_8_ << 0x20;
        }
        uVar18 = 0x80000000;
        if ((uVar14 & 2) != 0) {
          uVar18 = (ulong)(uint)(int)auVar30._8_8_;
        }
        local_68._0_8_ = uVar18 | uVar11;
        local_48 = QWidget::mapFromGlobal(pQVar1,(QPoint *)local_68);
      }
      else {
        auVar30 = QEventPoint::globalPosition();
        auVar28._0_8_ =
             (double)((ulong)auVar30._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
             auVar30._8_8_;
        auVar28._8_8_ =
             (double)((ulong)auVar30._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
             auVar30._0_8_;
        auVar30 = minpd(_DAT_0066f5d0,auVar28);
        auVar29._8_8_ = -(ulong)(-2147483648.0 < auVar30._8_8_);
        auVar29._0_8_ = -(ulong)(-2147483648.0 < auVar30._0_8_);
        uVar14 = movmskpd((int)lVar17,auVar29);
        uVar11 = 0x8000000000000000;
        if ((uVar14 & 1) != 0) {
          uVar11 = (ulong)(uint)(int)auVar30._0_8_ << 0x20;
        }
        uVar18 = 0x80000000;
        if ((uVar14 & 2) != 0) {
          uVar18 = (ulong)(uint)(int)auVar30._8_8_;
        }
        local_48 = (QPoint)(uVar18 | uVar11);
      }
      if ((*(byte *)(*(long *)(*(long *)(this + 0x10) + 0x20) + 0xc) & 1) == 0) {
        lVar17 = *(long *)(*(long *)(*(long *)(*(long *)(this + 0x10) + 8) + 0x10) + 0x20);
        register0x00000008 =
             (storage_type_conflict *)
             CONCAT44(*(int *)(lVar17 + 0x20) - *(int *)(lVar17 + 0x18),
                      *(int *)(lVar17 + 0x1c) - *(int *)(lVar17 + 0x14));
        local_68._0_4_ = 0;
        local_68._4_4_ = 0;
        cVar8 = QRect::contains((QPoint *)local_68,SUB81(&local_48,0));
        if (cVar8 == '\0') {
          if (local_48.xp.m_i < 0) {
            local_48 = (QPoint)((ulong)local_48 & 0xffffffff00000000);
          }
          if ((long)local_48 < 0) {
            local_48 = (QPoint)((ulong)local_48 & 0xffffffff);
          }
          lVar17 = *(long *)(*(long *)(*(long *)(*(long *)(this + 0x10) + 8) + 0x10) + 0x20);
          RVar15.m_i = (*(int *)(lVar17 + 0x1c) - *(int *)(lVar17 + 0x14)) + 1;
          if (RVar15.m_i < local_48.xp.m_i) {
            local_48.xp.m_i = RVar15.m_i;
          }
          RVar15.m_i = (*(int *)(lVar17 + 0x20) - *(int *)(lVar17 + 0x18)) + 1;
          if (RVar15.m_i < local_48.yp.m_i) {
            local_48.yp.m_i = RVar15.m_i;
          }
        }
      }
      RVar24.m_i = *(int *)(this + 0x28) + local_48.xp.m_i;
      iVar9 = *(int *)(this + 0x2c) + local_48.yp.m_i;
      RVar21.m_i = local_48.xp.m_i - *(int *)(this + 0x20);
      iVar20 = local_48.yp.m_i - *(int *)(this + 0x24);
      QGuiApplication::platformName();
      if (local_58 == 3) {
        QVar32.m_data = stack0xffffffffffffffa0;
        QVar32.m_size = 3;
        QVar34.m_data = "xcb";
        QVar34.m_size = 3;
        cVar8 = QtPrivate::equalStrings(QVar32,QVar34);
      }
      else {
        cVar8 = '\0';
      }
      if ((QPoint)local_68._0_8_ != (QPoint)0x0) {
        LOCK();
        *(int *)local_68._0_8_ = *(int *)local_68._0_8_ + -1;
        UNLOCK();
        if (*(int *)local_68._0_8_ == 0) {
          QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
        }
      }
      local_98 = iVar9;
      if (cVar8 != '\0') {
        QVar31 = QWidgetPrivate::availableScreenGeometry(*(QWidget **)(this + 0x10));
        if (RVar21.m_i <= QVar31.x1.m_i.m_i) {
          RVar21.m_i = QVar31.x1.m_i.m_i;
        }
        RVar6.m_i = QVar31.y1.m_i.m_i;
        if (QVar31.y1.m_i.m_i < iVar20) {
          RVar6.m_i = iVar20;
        }
        iVar20 = RVar6.m_i;
        if (QVar31.x2.m_i.m_i <= RVar24.m_i) {
          RVar24.m_i = QVar31.x2.m_i.m_i;
        }
        local_98 = QVar31.y2.m_i.m_i;
        if (iVar9 < QVar31.y2.m_i.m_i) {
          local_98 = iVar9;
        }
      }
      local_90 = qSmartMinSize(*(QWidget **)(this + 0x18));
      RVar16 = local_90.ht.m_i;
      if (*(QWidget **)(this + 0x18) != *(QWidget **)(this + 0x10)) {
        local_90.wd.m_i = local_90.wd.m_i.m_i + *(int *)(this + 0x34) * 2;
        local_90.ht.m_i = 0;
        RVar16.m_i = RVar16.m_i + *(int *)(this + 0x38) + *(int *)(this + 0x34) * 2;
      }
      QVar12 = QWidget::maximumSize(*(QWidget **)(this + 0x18));
      RVar25 = QVar12.ht.m_i;
      pQVar1 = *(QWidget **)(this + 0x10);
      if (*(QWidget **)(this + 0x18) != pQVar1) {
        QVar12.wd.m_i = QVar12.wd.m_i.m_i + *(int *)(this + 0x34) * 2;
        QVar12.ht.m_i = 0;
        RVar25.m_i = RVar25.m_i + *(int *)(this + 0x38) + *(int *)(this + 0x34) * 2;
      }
      RVar23.m_i = ((pQVar1->data->crect).x2.m_i - RVar21.m_i) + 1;
      RVar22.m_i = ((pQVar1->data->crect).y2.m_i - iVar20) + 1;
      QVar13 = QWidget::minimumSize(pQVar1);
      if (RVar23.m_i <= QVar13.wd.m_i.m_i) {
        RVar23.m_i = QVar13.wd.m_i.m_i;
      }
      if (RVar22.m_i <= QVar13.ht.m_i.m_i) {
        RVar22.m_i = QVar13.ht.m_i.m_i;
      }
      RVar10 = local_90.wd.m_i;
      if (RVar23.m_i <= RVar10.m_i) {
        RVar23.m_i = RVar10.m_i;
      }
      if (RVar22.m_i <= RVar16.m_i) {
        RVar22.m_i = RVar16.m_i;
      }
      RVar19 = QVar12.wd.m_i;
      if (RVar19.m_i <= RVar23.m_i) {
        RVar23.m_i = RVar19.m_i;
      }
      if (RVar25.m_i <= RVar22.m_i) {
        RVar22.m_i = RVar25.m_i;
      }
      pQVar2 = (*(QWidget **)(this + 0x10))->data;
      iVar9 = (pQVar2->crect).x2.m_i;
      iVar20 = (pQVar2->crect).y2.m_i;
      local_68._0_4_ = (pQVar2->crect).x1;
      local_68._4_4_ = (pQVar2->crect).y1;
      local_68._8_4_ = (pQVar2->crect).x2;
      RStack_5c.m_i = (pQVar2->crect).y2.m_i;
      if (*(int *)(this + 0x30) - 1U < 8) {
        local_68._0_4_ = (iVar9 - RVar23.m_i) + 1;
        local_68._4_4_ = (iVar20 - RVar22.m_i) + 1;
        switch(*(int *)(this + 0x30)) {
        case 2:
          local_68._0_4_ = (pQVar2->crect).x1.m_i;
          local_68._4_4_ = (pQVar2->crect).y1.m_i;
          break;
        case 3:
          local_68._4_4_ = (pQVar2->crect).y1.m_i;
          RVar24.m_i = iVar9;
          break;
        case 4:
          local_68._0_4_ = (pQVar2->crect).x1.m_i;
          local_98 = iVar20;
          break;
        case 5:
          local_68._0_4_ = (pQVar2->crect).x1.m_i;
          RVar24.m_i = iVar9;
          local_98 = iVar20;
          break;
        case 6:
          local_68._0_4_ = (pQVar2->crect).x1.m_i;
          local_68._4_4_ = (pQVar2->crect).y1.m_i;
          RVar24.m_i = iVar9;
          break;
        case 7:
          local_68._4_4_ = (pQVar2->crect).y1.m_i;
        case 1:
          RVar24.m_i = iVar9;
          local_98 = iVar20;
          break;
        case 8:
          local_68._0_4_ = (pQVar2->crect).x1.m_i;
          local_68._4_4_ = (pQVar2->crect).y1.m_i;
          local_98 = iVar20;
        }
        RStack_5c.m_i = local_98;
        local_68._8_4_ = RVar24.m_i;
      }
      uVar4 = local_68._0_8_;
      uVar3 = local_68._0_4_;
      uVar5 = local_68._4_4_;
      RVar23.m_i = (local_68._8_4_ - local_68._0_4_) + 1;
      RVar22.m_i = (RStack_5c.m_i - local_68._4_4_) + 1;
      QVar12 = QWidget::minimumSize(*(QWidget **)(this + 0x10));
      if (RVar23.m_i <= QVar12.wd.m_i.m_i) {
        RVar23.m_i = QVar12.wd.m_i.m_i;
      }
      if (RVar22.m_i <= QVar12.ht.m_i.m_i) {
        RVar22.m_i = QVar12.ht.m_i.m_i;
      }
      if (RVar23.m_i <= RVar10.m_i) {
        RVar23.m_i = RVar10.m_i;
      }
      if (RVar22.m_i <= RVar16.m_i) {
        RVar22.m_i = RVar16.m_i;
      }
      if (RVar19.m_i <= RVar23.m_i) {
        RVar23.m_i = RVar19.m_i;
      }
      if (RVar25.m_i <= RVar22.m_i) {
        RVar22.m_i = RVar25.m_i;
      }
      iVar20 = uVar3 + RVar23.m_i + -1;
      iVar9 = uVar5 + -1 + RVar22.m_i;
      stack0xffffffffffffffa0 = (storage_type_conflict *)CONCAT44(iVar9,iVar20);
      lVar17 = *(long *)(*(long *)(this + 0x10) + 0x20);
      local_68._0_8_ = uVar4;
      if ((((uVar3 != *(int *)(lVar17 + 0x14)) || (iVar20 != *(int *)(lVar17 + 0x1c))) ||
          (uVar5 != *(int *)(lVar17 + 0x18))) || (iVar9 != *(int *)(lVar17 + 0x20))) {
        if ((*(byte *)(lVar17 + 0xc) & 1) == 0) {
          lVar17 = *(long *)(*(long *)(*(long *)(*(long *)(this + 0x10) + 8) + 0x10) + 0x20);
          local_78.x2.m_i = *(int *)(lVar17 + 0x1c) - *(int *)(lVar17 + 0x14);
          local_78.y2.m_i = *(int *)(lVar17 + 0x20) - *(int *)(lVar17 + 0x18);
          local_78.x1.m_i = 0;
          local_78.y1.m_i = 0;
          cVar8 = QRect::intersects(&local_78);
          if (cVar8 == '\0') goto LAB_00475ba3;
        }
        QWidget::setGeometry(*(QWidget **)(this + 0x10),(QRect *)local_68);
      }
    }
    goto LAB_00475ba3;
  }
  iVar9 = *(int *)(this + 0x3c);
  if ((iVar9 < local_40.yp.m_i) || (iVar9 < local_40.xp.m_i)) {
    lVar17 = *(long *)(*(long *)(this + 0x10) + 0x20);
    iVar20 = (*(int *)(lVar17 + 0x20) - (iVar9 + *(int *)(lVar17 + 0x18))) + 1;
    if (local_40.yp.m_i < iVar20) {
LAB_0047567e:
      if (iVar9 < local_40.yp.m_i) {
LAB_00475686:
        if (local_40.yp.m_i < iVar20) {
          if (iVar9 < local_40.xp.m_i) {
            if (local_40.xp.m_i < (*(int *)(lVar17 + 0x1c) - (iVar9 + *(int *)(lVar17 + 0x14))) + 1)
            {
              register0x00000030 =
                   (storage_type_conflict *)
                   CONCAT44(*(int *)(lVar17 + 0x20) - *(int *)(lVar17 + 0x18),
                            *(int *)(lVar17 + 0x1c) - *(int *)(lVar17 + 0x14));
              local_68._0_4_ = 0;
              local_68._4_4_ = 0;
              cVar8 = QRect::contains((QPoint *)local_68,SUB81(&local_40,0));
              if (cVar8 == '\0') {
                *(undefined4 *)(this + 0x30) = 0;
              }
              else {
                *(undefined4 *)(this + 0x30) = 9;
              }
            }
            else {
              *(undefined4 *)(this + 0x30) = 8;
            }
          }
          else {
            *(undefined4 *)(this + 0x30) = 7;
          }
        }
        else {
          *(undefined4 *)(this + 0x30) = 6;
        }
      }
      else if (local_40.xp.m_i < (*(int *)(lVar17 + 0x1c) - (*(int *)(lVar17 + 0x14) + iVar9)) + 1)
      {
        if (iVar9 < local_40.yp.m_i) goto LAB_00475686;
        *(undefined4 *)(this + 0x30) = 5;
      }
      else {
        *(undefined4 *)(this + 0x30) = 4;
      }
    }
    else if (local_40.xp.m_i < (*(int *)(lVar17 + 0x1c) - (*(int *)(lVar17 + 0x14) + iVar9)) + 1) {
      if ((local_40.yp.m_i < iVar20) || (iVar9 < local_40.xp.m_i)) goto LAB_0047567e;
      *(undefined4 *)(this + 0x30) = 3;
    }
    else {
      *(undefined4 *)(this + 0x30) = 2;
    }
  }
  else {
    *(undefined4 *)(this + 0x30) = 1;
  }
  bVar7 = QWidget::isMinimized(*(QWidget **)(this + 0x10));
  if ((bVar7) || (((byte)this[0x40] & 4) == 0)) {
    *(undefined4 *)(this + 0x30) = 9;
  }
  setMouseCursor(this,*(MousePosition *)(this + 0x30));
LAB_00475ba3:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetResizeHandler::mouseMoveEvent(QMouseEvent *e)
{
    QPoint pos = widget->mapFromGlobal(e->globalPosition().toPoint());
    if (!active && !buttonDown) {
        if (pos.y() <= range && pos.x() <= range)
            mode = TopLeft;
        else if (pos.y() >= widget->height()-range && pos.x() >= widget->width()-range)
            mode = BottomRight;
        else if (pos.y() >= widget->height()-range && pos.x() <= range)
            mode = BottomLeft;
        else if (pos.y() <= range && pos.x() >= widget->width()-range)
            mode = TopRight;
        else if (pos.y() <= range)
            mode = Top;
        else if (pos.y() >= widget->height()-range)
            mode = Bottom;
        else if (pos.x() <= range)
            mode = Left;
        else if ( pos.x() >= widget->width()-range)
            mode = Right;
        else if (widget->rect().contains(pos))
            mode = Center;
        else
            mode = Nowhere;

        if (widget->isMinimized() || !isEnabled())
            mode = Center;
#ifndef QT_NO_CURSOR
        setMouseCursor(mode);
#endif
        return;
    }

    if (mode == Center)
        return;

    if (widget->testAttribute(Qt::WA_WState_ConfigPending))
        return;


    QPoint globalPos = (!widget->isWindow() && widget->parentWidget()) ?
                       widget->parentWidget()->mapFromGlobal(e->globalPosition().toPoint()) : e->globalPosition().toPoint();
    if (!widget->isWindow() && !widget->parentWidget()->rect().contains(globalPos)) {
        if (globalPos.x() < 0)
            globalPos.rx() = 0;
        if (globalPos.y() < 0)
            globalPos.ry() = 0;
        if (globalPos.x() > widget->parentWidget()->width())
            globalPos.rx() = widget->parentWidget()->width();
        if (globalPos.y() > widget->parentWidget()->height())
            globalPos.ry() = widget->parentWidget()->height();
    }

    QPoint p = globalPos + invertedMoveOffset;
    QPoint pp = globalPos - moveOffset;

    // Workaround for window managers which refuse to move a tool window partially offscreen.
    if (QGuiApplication::platformName() == "xcb"_L1) {
        const QRect desktop = QWidgetPrivate::availableScreenGeometry(widget);
        pp.rx() = qMax(pp.x(), desktop.left());
        pp.ry() = qMax(pp.y(), desktop.top());
        p.rx() = qMin(p.x(), desktop.right());
        p.ry() = qMin(p.y(), desktop.bottom());
    }

    QSize ms = qSmartMinSize(childWidget);
    int mw = ms.width();
    int mh = ms.height();
    if (childWidget != widget) {
        mw += 2 * fw;
        mh += 2 * fw + extrahei;
    }

    QSize maxsize(childWidget->maximumSize());
    if (childWidget != widget)
        maxsize += QSize(2 * fw, 2 * fw + extrahei);
    QSize mpsize(widget->geometry().right() - pp.x() + 1,
                  widget->geometry().bottom() - pp.y() + 1);
    mpsize = mpsize.expandedTo(widget->minimumSize()).expandedTo(QSize(mw, mh))
                    .boundedTo(maxsize);
    QPoint mp(widget->geometry().right() - mpsize.width() + 1,
               widget->geometry().bottom() - mpsize.height() + 1);

    QRect geom = widget->geometry();

    switch (mode) {
    case TopLeft:
        geom = QRect(mp, widget->geometry().bottomRight()) ;
        break;
    case BottomRight:
        geom = QRect(widget->geometry().topLeft(), p) ;
        break;
    case BottomLeft:
        geom = QRect(QPoint(mp.x(), widget->geometry().y()), QPoint(widget->geometry().right(), p.y())) ;
        break;
    case TopRight:
        geom = QRect(QPoint(widget->geometry().x(), mp.y()), QPoint(p.x(), widget->geometry().bottom())) ;
        break;
    case Top:
        geom = QRect(QPoint(widget->geometry().left(), mp.y()), widget->geometry().bottomRight()) ;
        break;
    case Bottom:
        geom = QRect(widget->geometry().topLeft(), QPoint(widget->geometry().right(), p.y())) ;
        break;
    case Left:
        geom = QRect(QPoint(mp.x(), widget->geometry().top()), widget->geometry().bottomRight()) ;
        break;
    case Right:
        geom = QRect(widget->geometry().topLeft(), QPoint(p.x(), widget->geometry().bottom())) ;
        break;
    default:
        break;
    }

    geom = QRect(geom.topLeft(),
                  geom.size().expandedTo(widget->minimumSize())
                             .expandedTo(QSize(mw, mh))
                             .boundedTo(maxsize));

    if (geom != widget->geometry() &&
        (widget->isWindow() || widget->parentWidget()->rect().intersects(geom))) {
        widget->setGeometry(geom);
    }
}